

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O3

uint Imf_2_5::uiMult<unsigned_int>(uint a,uint b)

{
  OverflowExc *this;
  
  if ((a != 0) && ((int)((ulong)a * (ulong)b >> 0x20) != 0)) {
    this = (OverflowExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::OverflowExc::OverflowExc(this,"Integer multiplication overflow.");
    __cxa_throw(this,&Iex_2_5::OverflowExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  return b * a;
}

Assistant:

T
uiMult (T a, T b)
{
    //
    // Unsigned integer multiplication
    //

    IMF_STATIC_ASSERT (!std::numeric_limits<T>::is_signed &&
                        std::numeric_limits<T>::is_integer);

    if (a > 0 && b > std::numeric_limits<T>::max() / a)
        throw IEX_NAMESPACE::OverflowExc ("Integer multiplication overflow.");

    return a * b;
}